

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall
amrex::MLMG::prepareForSolve
          (MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
          Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs)

{
  MLLinOp *pMVar1;
  _func_int **pp_Var2;
  pointer pAVar3;
  __uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_> _Var4;
  pointer pAVar5;
  long *plVar6;
  long *plVar7;
  bool bVar8;
  long *plVar9;
  undefined8 uVar10;
  int iVar11;
  int extraout_var;
  long lVar12;
  int extraout_EDX;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_type __new_size;
  long lVar16;
  IntVect ng_sol;
  long *local_1f0;
  undefined8 local_1e8;
  int local_1e0;
  undefined8 local_1d8;
  int local_1d0;
  undefined8 local_1cc;
  int local_1c4;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_1c0;
  undefined1 local_1b8 [16];
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_1a8;
  undefined8 auStack_1a0 [46];
  
  local_1b8._0_8_ = (innards_base *)0x0;
  local_1c0 = a_rhs;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&(this->timer).super_vector<double,_std::allocator<double>_>,3,
             (value_type_conflict2 *)local_1b8);
  local_1cc = (innards_base *)0x0;
  local_1c4 = 0;
  local_1d8 = (innards_base *)0x100000001;
  local_1d0 = 1;
  pMVar1 = this->linop;
  uVar15 = (ulong)(uint)(pMVar1->info).hidden_direction;
  if (uVar15 < 3) {
    *(undefined4 *)((long)&local_1d8 + uVar15 * 4) = 0;
  }
  pp_Var2 = pMVar1->_vptr_MLLinOp;
  if (this->linop_prepared == false) {
    (*pp_Var2[0x1d])();
    this->linop_prepared = true;
  }
  else {
    iVar11 = (*pp_Var2[7])();
    if ((char)iVar11 != '\0') {
      (*this->linop->_vptr_MLLinOp[8])();
    }
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&(this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)this->namrlevs
            );
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->sol_is_alias).super_vector<int,_std::allocator<int>_>,(long)this->namrlevs);
  iVar11 = this->namrlevs;
  if (0 < iVar11) {
    uVar15 = 0;
    do {
      if (this->cf_strategy == ghostnodes) {
        (*this->linop->_vptr_MLLinOp[0x2a])
                  ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                   (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15);
        uVar10 = local_1b8._0_8_;
        pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._0_8_ = (innards_base *)0x0;
        _Var4._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar3[uVar15].m_ptr._M_t;
        pAVar3[uVar15].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )uVar10;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
          (*(*(_func_int ***)local_1b8._0_8_)[2])();
        }
LAB_0064ba95:
        iVar11 = 1;
      }
      else {
        iVar11 = (*this->linop->_vptr_MLLinOp[0x2b])
                           (this->linop,
                            (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar15);
        if ((((int)local_1d8 == iVar11) && (local_1d8._4_4_ == extraout_var)) &&
           (extraout_EDX == local_1d0)) {
          (*this->linop->_vptr_MLLinOp[0x2a])
                    ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                     (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar15);
          uVar10 = local_1b8._0_8_;
          pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1b8._0_8_ = (innards_base *)0x0;
          _Var4._M_t.
          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
               *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *
                )&pAVar3[uVar15].m_ptr._M_t;
          pAVar3[uVar15].m_ptr._M_t =
               (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
                )uVar10;
          if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )_Var4._M_t.
                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )0x0) {
            (**(code **)(*(long *)_Var4._M_t.
                                  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                  _M_head_impl + 0x10))();
          }
          if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
            (*(*(_func_int ***)local_1b8._0_8_)[2])();
          }
          (*this->linop->_vptr_MLLinOp[0x2f])
                    (this->linop,
                     (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar15);
          goto LAB_0064ba95;
        }
        if (this->solve_called == 0) {
          (*this->linop->_vptr_MLLinOp[0x27])
                    ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                     uVar15 & 0xffffffff,0,&local_1d8);
          uVar10 = local_1b8._0_8_;
          pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1b8._0_8_ = (innards_base *)0x0;
          _Var4._M_t.
          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
               *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *
                )&pAVar3[uVar15].m_ptr._M_t;
          pAVar3[uVar15].m_ptr._M_t =
               (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
                )uVar10;
          if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )_Var4._M_t.
                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )0x0) {
            (**(code **)(*(long *)_Var4._M_t.
                                  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                  _M_head_impl + 0x10))();
          }
          if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
            (*(*(_func_int ***)local_1b8._0_8_)[2])();
          }
        }
        local_1b8._0_8_ = (innards_base *)0x0;
        local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
        (*this->linop->_vptr_MLLinOp[0x2c])
                  (this->linop,
                   (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15,
                   (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        (*this->linop->_vptr_MLLinOp[0x2f])
                  (this->linop,
                   (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15);
        iVar11 = 0;
      }
      (this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar15]
           = iVar11;
      uVar15 = uVar15 + 1;
      iVar11 = this->namrlevs;
    } while ((long)uVar15 < (long)iVar11);
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&(this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)iVar11);
  if (0 < this->namrlevs) {
    lVar13 = 0;
    lVar16 = 0;
    uVar15 = 0;
    do {
      if (this->cf_strategy == ghostnodes) {
        local_1c4 = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar15 & 0xffffffff,0);
        local_1cc = (innards_base *)CONCAT44(local_1c4,local_1c4);
      }
      if (this->solve_called == 0) {
        (*this->linop->_vptr_MLLinOp[0x27])
                  ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                   uVar15 & 0xffffffff,0,&local_1cc);
        uVar10 = local_1b8._0_8_;
        pAVar3 = (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._0_8_ = (innards_base *)0x0;
        _Var4._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar3[uVar15].m_ptr._M_t;
        pAVar3[uVar15].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )uVar10;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var4._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var4._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
          (*(*(_func_int ***)local_1b8._0_8_)[2])();
        }
      }
      (*this->linop->_vptr_MLLinOp[0x2c])
                (this->linop,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16,(long)&(((local_1c0->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl
                                 .super__Vector_impl_data._M_start)->m_ptr)._M_t.
                               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                               _M_head_impl + lVar16,&local_1cc);
      (*this->linop->_vptr_MLLinOp[0x15])(this->linop,uVar15 & 0xffffffff,0);
      (*this->linop->_vptr_MLLinOp[0x17])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      (*this->linop->_vptr_MLLinOp[0x18])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      (*this->linop->_vptr_MLLinOp[0x19])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      (*this->linop->_vptr_MLLinOp[0x1a])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      pMVar1 = this->linop;
      lVar12 = **(long **)((long)&(((pMVar1->m_factory).
                                    super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                  ).
                                  super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar13);
      if (lVar12 != 0) {
        lVar12 = __dynamic_cast(lVar12,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo);
        if (lVar12 != 0) {
          (*pMVar1->_vptr_MLLinOp[0x30])
                    (pMVar1,(long)&(((this->rhs).
                                     super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                   super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                   .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                   _M_head_impl + lVar16);
          (*this->linop->_vptr_MLLinOp[0x30])
                    (this->linop,
                     (long)&(((this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                              super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                              super__Vector_impl_data._M_start)->m_ptr)._M_t.
                            super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                            .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                     lVar16);
        }
      }
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 8;
      lVar13 = lVar13 + 0x18;
    } while ((long)uVar15 < (long)this->namrlevs);
  }
  uVar15 = (ulong)this->finest_amr_lev;
  if (0 < (long)uVar15) {
    lVar13 = uVar15 * 8;
    do {
      pAVar3 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar5 = (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*this->linop->_vptr_MLLinOp[0x3e])
                (this->linop,uVar15 - 1 & 0xffffffff,
                 (long)&pAVar3[-1].m_ptr._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar13,(long)&pAVar5[-1].m_ptr._M_t.
                               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                               _M_head_impl + lVar13,
                 (long)&(pAVar3->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar13,(long)&(pAVar5->m_ptr)._M_t.
                               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                               _M_head_impl + lVar13);
      lVar13 = lVar13 + -8;
      bVar8 = 1 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar8);
  }
  iVar11 = (*this->linop->_vptr_MLLinOp[0x1e])(this->linop,0);
  if (((char)iVar11 != '\0') && (this->linop->enforceSingularSolvable == true)) {
    makeSolvable(this);
  }
  pMVar1 = this->linop;
  if (((pMVar1->m_ixtype).vect[1] == 0 && (pMVar1->m_ixtype).vect[0] == 0) &&
     ((pMVar1->m_ixtype).vect[2] == 0)) {
    local_1e0 = 0;
  }
  else {
    local_1e0 = 1;
  }
  local_1e8 = (innards_base *)CONCAT44(local_1e0,local_1e0);
  if (this->cf_strategy == ghostnodes) {
    local_1e0 = local_1c4;
    local_1e8 = local_1cc;
  }
  if (this->solve_called == 0) {
    MLLinOp::make(pMVar1,&this->res,(IntVect *)&local_1e8);
    MLLinOp::make(this->linop,&this->rescor,(IntVect *)&local_1e8);
  }
  if (-1 < this->finest_amr_lev) {
    lVar13 = 0;
    do {
      lVar16 = (long)(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar13];
      if (0 < lVar16) {
        lVar12 = 0;
        do {
          (*this->linop->_vptr_MLLinOp[0x2e])
                    (this->linop,
                     *(long *)&(this->res).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar13].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar12)
          ;
          (*this->linop->_vptr_MLLinOp[0x2e])
                    (this->linop,
                     *(long *)&(this->rescor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar13].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar12)
          ;
          lVar12 = lVar12 + 8;
        } while (lVar16 * 8 != lVar12);
      }
      bVar8 = lVar13 < this->finest_amr_lev;
      lVar13 = lVar13 + 1;
    } while (bVar8);
  }
  if (this->cf_strategy != ghostnodes) {
    local_1e0 = local_1d0;
    local_1e8 = local_1d8;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&(this->cor).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(long)this->namrlevs);
  if (-1 < this->finest_amr_lev) {
    uVar15 = 0;
    do {
      __new_size = (size_type)
                   (this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar15];
      std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
                (&(this->cor).
                  super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                  super_vector<amrex::Any,_std::allocator<amrex::Any>_>,__new_size);
      if (0 < (long)__new_size) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          if (this->solve_called == 0) {
            local_1b8._8_4_ = local_1e0;
            local_1b8._0_8_ = local_1e8;
            if (this->cf_strategy == ghostnodes) {
              local_1b8._4_4_ =
                   (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar15 & 0xffffffff,uVar14);
              local_1b8._0_4_ = local_1b8._4_4_;
              local_1b8._8_4_ = local_1b8._4_4_;
            }
            (*this->linop->_vptr_MLLinOp[0x27])
                      (&local_1f0,this->linop,uVar15 & 0xffffffff,uVar14,
                       (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
            plVar7 = local_1f0;
            lVar16 = *(long *)&(this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
            local_1f0 = (long *)0x0;
            plVar6 = *(long **)(lVar16 + lVar13);
            *(long **)(lVar16 + lVar13) = plVar7;
            if (plVar6 != (long *)0x0) {
              (**(code **)(*plVar6 + 0x10))();
            }
            if (local_1f0 != (long *)0x0) {
              (**(code **)(*local_1f0 + 0x10))();
            }
          }
          (*this->linop->_vptr_MLLinOp[0x2e])
                    (this->linop,
                     *(long *)&(this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar13)
          ;
          uVar14 = (ulong)((int)uVar14 + 1);
          lVar13 = lVar13 + 8;
        } while (__new_size * 8 != lVar13);
      }
      bVar8 = (long)uVar15 < (long)this->finest_amr_lev;
      uVar15 = uVar15 + 1;
    } while (bVar8);
  }
  iVar11 = 2;
  if (2 < this->namrlevs) {
    iVar11 = this->namrlevs;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&(this->cor_hold).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(ulong)(iVar11 - 1));
  iVar11 = *(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&((this->cor_hold).
               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)iVar11);
  if (1 < (long)iVar11) {
    lVar13 = 0;
    uVar15 = 0;
    do {
      if (this->solve_called == 0) {
        local_1b8._8_4_ = local_1e0;
        local_1b8._0_8_ = local_1e8;
        if (this->cf_strategy == ghostnodes) {
          local_1b8._4_4_ = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,uVar15);
          local_1b8._0_4_ = local_1b8._4_4_;
          local_1b8._8_4_ = local_1b8._4_4_;
        }
        (*this->linop->_vptr_MLLinOp[0x27])
                  (&local_1f0,this->linop,0,uVar15,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        plVar7 = local_1f0;
        lVar16 = *(long *)&(((this->cor_hold).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
        local_1f0 = (long *)0x0;
        plVar6 = *(long **)(lVar16 + lVar13);
        *(long **)(lVar16 + lVar13) = plVar7;
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x10))();
        }
        if (local_1f0 != (long *)0x0) {
          (**(code **)(*local_1f0 + 0x10))();
        }
      }
      (*this->linop->_vptr_MLLinOp[0x2e])();
      uVar15 = (ulong)((int)uVar15 + 1);
      lVar13 = lVar13 + 8;
    } while ((ulong)(iVar11 - 1) << 3 != lVar13);
  }
  if (1 < this->finest_amr_lev) {
    uVar15 = 1;
    lVar13 = 0x18;
    do {
      std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
                ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                 ((long)&(((this->cor_hold).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar13),1);
      if (this->solve_called == 0) {
        local_1b8._8_4_ = local_1e0;
        local_1b8._0_8_ = local_1e8;
        if (this->cf_strategy == ghostnodes) {
          local_1b8._4_4_ = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar15 & 0xffffffff,0);
          local_1b8._0_4_ = local_1b8._4_4_;
          local_1b8._8_4_ = local_1b8._4_4_;
        }
        (*this->linop->_vptr_MLLinOp[0x27])
                  (&local_1f0,this->linop,uVar15 & 0xffffffff,0,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        plVar9 = local_1f0;
        plVar6 = *(long **)((long)&(((this->cor_hold).
                                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar13);
        local_1f0 = (long *)0x0;
        plVar7 = (long *)*plVar6;
        *plVar6 = (long)plVar9;
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 0x10))();
        }
        if (local_1f0 != (long *)0x0) {
          (**(code **)(*local_1f0 + 0x10))();
        }
      }
      (*this->linop->_vptr_MLLinOp[0x2e])
                (this->linop,
                 *(undefined8 *)
                  ((long)&(((this->cor_hold).
                            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar13));
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x18;
    } while ((long)uVar15 < (long)this->finest_amr_lev);
  }
  if (this->linop->m_parent == (MLLinOp *)0x0) {
    iVar11 = (*this->linop->_vptr_MLLinOp[0x25])();
    if ((char)iVar11 != '\0') goto LAB_0064c1de;
  }
  this->do_nsolve = 0;
LAB_0064c1de:
  if ((this->do_nsolve != 0) &&
     ((this->ns_linop)._M_t.
      super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
      super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl == (MLLinOp *)0x0)) {
    prepareForNSolve(this);
  }
  if (1 < this->verbose) {
    local_1b8._8_8_ = OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    *(undefined8 *)((long)auStack_1a0 + *(long *)((long)local_1a8._M_head_impl + -0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"MLMG: # of AMR levels: ",0x17);
    std::ostream::operator<<(&local_1a8,this->namrlevs);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"      # of MG levels on the coarsest AMR level: ",0x30);
    std::ostream::operator<<
              (&local_1a8,
               *(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    Print::~Print((Print *)local_1b8);
    if ((this->ns_linop)._M_t.
        super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
        super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl != (MLLinOp *)0x0) {
      local_1b8._8_8_ = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      *(undefined8 *)((long)auStack_1a0 + *(long *)((long)local_1a8._M_head_impl + -0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"      # of MG levels in N-Solve: ",0x21);
      std::ostream::operator<<
                (&local_1a8,
                 **(int **)&(((this->ns_linop)._M_t.
                              super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>
                              .super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl)->
                            m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"      # of grids in N-Solve: ",0x1d);
      std::ostream::_M_insert<long>((long)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
  }
  return;
}

Assistant:

void
MLMG::prepareForSolve (Vector<Any>& a_sol, const Vector<Any>& a_rhs)
{
    BL_PROFILE("MLMG::prepareForSolve()");

    AMREX_ASSERT(namrlevs <= a_sol.size());
    AMREX_ASSERT(namrlevs <= a_rhs.size());

    timer.assign(ntimers, 0.0);

    IntVect ng_rhs(0);
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();

#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        hypre_solver.reset();
        hypre_bndry.reset();
        hypre_node_solver.reset();
#endif

#ifdef AMREX_USE_PETSC
        petsc_solver.reset();
        petsc_bndry.reset();
#endif
    }

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else if (linop.AnyGrowVect(a_sol[alev]) == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (!solve_called) {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            linop.AnyCopy(sol[alev], a_sol[alev], IntVect(0));
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = false;
        }
    }

    rhs.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes) ng_rhs = IntVect(linop.getNGrow(alev));
        if (!solve_called) {
            rhs[alev] = linop.AnyMake(alev, 0, ng_rhs);
        }
        linop.AnyCopy(rhs[alev], a_rhs[alev], ng_rhs);
        linop.applyMetricTerm(alev, 0, rhs[alev]);
        linop.unimposeNeumannBC(alev, rhs[alev]);
        linop.applyInhomogNeumannTerm(alev, rhs[alev]);
        linop.applyOverset(alev, rhs[alev]);
        linop.scaleRHS(alev, rhs[alev]);

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(linop.Factory(alev));
        if (factory) {
            linop.AnySetCoveredToZero(rhs[alev]);
            linop.AnySetCoveredToZero(sol[alev]);
        }
#endif
    }

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        linop.AnyAverageDownSolutionRHS(falev-1, sol[falev-1], rhs[falev-1],
                                        sol[falev], rhs[falev]);
    }

    // enforce solvability if appropriate
    if (linop.isSingular(0) && linop.getEnforceSingularSolvable())
    {
        makeSolvable();
    }

    IntVect ng = linop.isCellCentered() ? IntVect(0) : IntVect(1);
    if (cf_strategy == CFStrategy::ghostnodes) ng = ng_rhs;
    if (!solve_called) {
        linop.make(res, ng);
        linop.make(rescor, ng);
    }
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            linop.AnySetToZero(res   [alev][mglev]);
            linop.AnySetToZero(rescor[alev][mglev]);
        }
    }

    if (cf_strategy != CFStrategy::ghostnodes) ng = ng_sol;
    cor.resize(namrlevs);
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        cor[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor[alev][mglev]);
        }
    }

    cor_hold.resize(std::max(namrlevs-1,1));
    {
        const int alev = 0;
        const int nmglevs = linop.NMGLevels(alev);
        cor_hold[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs-1; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor_hold[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor_hold[alev][mglev]);
        }
    }
    for (int alev = 1; alev < finest_amr_lev; ++alev)
    {
        cor_hold[alev].resize(1);
        if (!solve_called) {
            IntVect _ng = ng;
            if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev));
            cor_hold[alev][0] = linop.AnyMake(alev, 0, _ng);
        }
        linop.AnySetToZero(cor_hold[alev][0]);
    }

    if (linop.m_parent) {
        do_nsolve = false;  // no embedded N-Solve
    } else if (!linop.supportNSolve()) {
        do_nsolve = false;
    }

    if (do_nsolve && ns_linop == nullptr)
    {
        prepareForNSolve();
    }

    if (verbose >= 2) {
        amrex::Print() << "MLMG: # of AMR levels: " << namrlevs << "\n"
                       << "      # of MG levels on the coarsest AMR level: " << linop.NMGLevels(0)
                       << "\n";
        if (ns_linop) {
            amrex::Print() << "      # of MG levels in N-Solve: " << ns_linop->NMGLevels(0) << "\n"
                           << "      # of grids in N-Solve: " << ns_linop->m_grids[0][0].size() << "\n";
        }
    }
}